

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

void __thiscall
cmsys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  char *pcVar1;
  ulong uVar2;
  
  memset(this,0,0x208);
  if (rxp->program == (char *)0x0) {
    this->program = (char *)0x0;
  }
  else {
    uVar2 = (ulong)rxp->progsize;
    this->progsize = rxp->progsize;
    pcVar1 = (char *)operator_new__(uVar2);
    this->program = pcVar1;
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      this->program[uVar2 - 1] = rxp->program[uVar2 - 1];
    }
    memcpy(this,rxp,0x208);
    pcVar1 = rxp->regmust;
    this->regmust = pcVar1;
    if (pcVar1 != (char *)0x0) {
      uVar2 = 0;
      if (rxp->program != pcVar1) {
        uVar2 = (ulong)(uint)((int)pcVar1 - (int)rxp->program);
      }
      this->regmust = this->program + uVar2;
    }
    this->regstart = rxp->regstart;
    this->reganch = rxp->reganch;
    this->regmlen = rxp->regmlen;
  }
  return;
}

Assistant:

RegularExpression::RegularExpression(const RegularExpression& rxp)
{
  if (!rxp.program) {
    this->program = nullptr;
    return;
  }
  int ind;
  this->progsize = rxp.progsize;            // Copy regular expression size
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust != nullptr) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data
}